

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void Qentem::QTest::PrintInfo(void)

{
  long *plVar1;
  char *pcVar2;
  char *pcVar3;
  wchar_t *pwVar4;
  wostream *pwVar5;
  wchar_t local_20;
  wchar_t local_1c;
  
  pcVar2 = TestOutPut::GetColor(TITLE);
  pcVar3 = TestOutPut::GetColor(END);
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  pwVar5 = std::operator<<(pwVar5,pcVar2);
  pwVar5 = std::operator<<(pwVar5,"Configurations");
  pwVar5 = std::operator<<(pwVar5,pcVar3);
  std::operator<<(pwVar5,":\n");
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar5,"Arch: 64-bit\n");
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  pwVar5 = std::operator<<(pwVar5,"SizeT: ");
  pwVar5 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar5);
  std::operator<<(pwVar5," bytes:\n");
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar5,"Endianness: Little-Endian\n");
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar5,"Streaming SIMD Extensions 2: On\n");
  pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar5 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar5,"Auto Escape HTML: On\n");
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    plVar1 = *(long **)(*(long *)(std::wcout + -0x18) + 0x121158);
    if (plVar1 == (long *)0x0) goto LAB_00113736;
    local_20 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
    pwVar4 = &local_20;
    pwVar5 = (wostream *)&std::wcout;
  }
  else {
    plVar1 = *(long **)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x100 +
                       *(long *)(*(long *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ +
                                          0x10) + -0x18));
    if (plVar1 == (long *)0x0) {
LAB_00113736:
      std::__throw_bad_cast();
    }
    pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
    local_1c = (**(code **)(*plVar1 + 0x50))(plVar1,10);
    pwVar4 = &local_1c;
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar5,pwVar4,1);
  return;
}

Assistant:

QENTEM_NOINLINE static void PrintInfo() {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), "Configurations",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ":\n");
        if QENTEM_CONST_EXPRESSION (Config::Is64bit) {
            TestOutPut::Print("Arch: 64-bit\n");
        } else {
            TestOutPut::Print("Arch: 32-bit\n");
        }

        TestOutPut::Print("SizeT: ", sizeof(SizeT), " bytes:\n");

        if QENTEM_CONST_EXPRESSION (Config::IsBigEndian) {
            TestOutPut::Print("Endianness: Big-Endian\n");
        } else {
            TestOutPut::Print("Endianness: Little-Endian\n");
        }
#if defined(QENTEM_AVX2) && (QENTEM_AVX2 == 1)
        TestOutPut::Print("Advanced Vector Extensions: On\n");
#endif

#if defined(QENTEM_SSE2) && (QENTEM_SSE2 == 1)
        TestOutPut::Print("Streaming SIMD Extensions 2: On\n");
#endif

#if defined(QENTEM_MSIMD128) && (QENTEM_MSIMD128 == 1)
        TestOutPut::Print("WASM SIMD128: On\n");
#endif

        if QENTEM_CONST_EXPRESSION (Config::AutoEscapeHTML) {
            TestOutPut::Print("Auto Escape HTML: On\n");
        }

        TestOutPut::Print('\n');
    }